

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void laguerre_associated(int n,int m,double x,double *cx)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  int iVar4;
  double dVar5;
  
  if (-1 < m) {
    if (((-1 < n) && (*cx = 1.0, n != 0)) && (cx[1] = (double)(m + 1) - x, n != 1)) {
      dVar5 = cx[1];
      uVar1 = ~m;
      iVar4 = m + 3;
      uVar3 = 2;
      do {
        dVar5 = ((double)(int)uVar1 * cx[uVar3 - 2] + ((double)iVar4 - x) * dVar5) /
                (double)(int)uVar3;
        cx[uVar3] = dVar5;
        uVar3 = uVar3 + 1;
        uVar1 = uVar1 - 1;
        iVar4 = iVar4 + 2;
      } while (n + 1 != uVar3);
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"LAGUERRE_ASSOCIATED - Fatal error!\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  Input value of M = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,m);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cerr,"  but M must be nonnegative.\n");
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void laguerre_associated ( int n, int m, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_ASSOCIATED evaluates the associated Laguerre polynomials L(N,M,X) at X.
//
//  Differential equation:
//
//    X Y'' + (M+1-X) Y' + (N-M) Y = 0
//
//  First terms:
//
//    M = 0
//
//    L(0,0,X) =   1
//    L(1,0,X) =  -X    +  1
//    L(2,0,X) =   X^2 -  4 X     +  2
//    L(3,0,X) =  -X^3 +  9 X^2 -  18 X    +    6
//    L(4,0,X) =   X^4 - 16 X^3 +  72 X^2 -   96 X +      24
//    L(5,0,X) =  -X^5 + 25 X^4 - 200 X^3 +  600 X^2 -  600 x    +  120
//    L(6,0,X) =   X^6 - 36 X^5 + 450 X^4 - 2400 X^3 + 5400 X^2 - 4320 X + 720
//
//    M = 1
//
//    L(0,1,X) =    0
//    L(1,1,X) =   -1,
//    L(2,1,X) =    2 X - 4,
//    L(3,1,X) =   -3 X^2 + 18 X - 18,
//    L(4,1,X) =    4 X^3 - 48 X^2 + 144 X - 96
//
//    M = 2
//
//    L(0,2,X) =    0
//    L(1,2,X) =    0,
//    L(2,2,X) =    2,
//    L(3,2,X) =   -6 X + 18,
//    L(4,2,X) =   12 X^2 - 96 X + 144
//
//    M = 3
//
//    L(0,3,X) =    0
//    L(1,3,X) =    0,
//    L(2,3,X) =    0,
//    L(3,3,X) =   -6,
//    L(4,3,X) =   24 X - 96
//
//    M = 4
//
//    L(0,4,X) =    0
//    L(1,4,X) =    0
//    L(2,4,X) =    0
//    L(3,4,X) =    0
//    L(4,4,X) =   24
//
//  Recursion:
//
//    if N = 0:
//
//      L(N,M,X)   = 0
//
//    if N = 1:
//
//      L(N,M,X)   = (M+1-X)
//
//    if N => 2:
//
//      L(N,M,X)   = ( (M+2*N-1-X) * L(N-1,M,X)
//                  +   (1-M-N)     * L(N-2,M,X) ) / N
//
//  Special values:
//
//    For M = 0, the associated Laguerre polynomials L(N,M,X) are equal
//    to the Laguerre polynomials L(N,X).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    08 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Input, int M, the parameter.  M must be nonnegative.
//
//    Input, double X, the point at which the polynomials are to be evaluated.
//
//    Output, double CX[N+1], the associated Laguerre polynomials of
//    degrees 0 through N evaluated at the point X.
//
{
  int i;

  if ( m < 0 )
  {
    std::cerr << "\n";
    std::cerr << "LAGUERRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of M = " << m << "\n";
    std::cerr << "  but M must be nonnegative.\n";
    exit ( 1 );
  }

  if ( n < 0 )
  {
    return;
  }

  cx[0] = 1.0;

  if ( n == 0 )
  {
    return;
  }

  cx[1] = double( m + 1 ) - x;

  for ( i = 2; i <= n; i++ )
  {
    cx[i] = ( ( double( 2 * i + m - 1 ) - x ) * cx[i-1]
              + double(   - i - m + 1 )       * cx[i-2] ) 
              / double(i);
  }

  return;
}